

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O0

string * __thiscall
spvtools::FriendlyNameMapper::NameForEnumOperand_abi_cxx11_
          (string *__return_storage_ptr__,FriendlyNameMapper *this,spv_operand_type_t type,
          uint32_t word)

{
  char *__s;
  spv_result_t sVar1;
  uint32_t id;
  string local_78;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_29;
  spv_operand_desc local_28;
  spv_operand_desc desc;
  uint32_t word_local;
  spv_operand_type_t type_local;
  FriendlyNameMapper *this_local;
  
  local_28 = (spv_operand_desc)0x0;
  desc._0_4_ = word;
  desc._4_4_ = type;
  _word_local = this;
  this_local = (FriendlyNameMapper *)__return_storage_ptr__;
  sVar1 = AssemblyGrammar::lookupOperand(&this->grammar_,type,word,&local_28);
  if (sVar1 == SPV_SUCCESS) {
    __s = local_28->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"StorageClass",&local_51)
    ;
    (anonymous_namespace)::to_string_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)(ulong)(uint32_t)desc,id);
    std::operator+(__return_storage_ptr__,&local_50,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FriendlyNameMapper::NameForEnumOperand(spv_operand_type_t type,
                                                   uint32_t word) {
  spv_operand_desc desc = nullptr;
  if (SPV_SUCCESS == grammar_.lookupOperand(type, word, &desc)) {
    return desc->name;
  } else {
    // Invalid input.  Just give something.
    return std::string("StorageClass") + to_string(word);
  }
}